

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O1

void Llb_NonlinAddPartition(Llb_Mgr_t *p,int i,DdNode *bFunc)

{
  int iVar1;
  Llb_Prt_t **ppLVar2;
  Llb_Prt_t *pLVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  
  if (*(int *)((ulong)bFunc & 0xfffffffffffffffe) == 0x7fffffff) {
    __assert_fail("!Cudd_IsConstant(bFunc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb3Image.c"
                  ,0x277,"void Llb_NonlinAddPartition(Llb_Mgr_t *, int, DdNode *)");
  }
  pLVar3 = (Llb_Prt_t *)calloc(1,0x18);
  p->pParts[i] = pLVar3;
  ppLVar2 = p->pParts;
  pLVar3 = ppLVar2[i];
  pLVar3->iPart = i;
  pLVar3->bFunc = bFunc;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x10;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x40);
  pVVar4->pArray = piVar5;
  ppLVar2[i]->vVars = pVVar4;
  Extra_SupportArray(p->dd,bFunc,p->pSupp);
  if (p->nVars < 1) {
    iVar7 = 0;
  }
  else {
    lVar6 = 0;
    iVar7 = 0;
    do {
      iVar1 = p->pSupp[lVar6];
      if ((iVar1 != 0) && (p->pVars2Q[lVar6] != 0)) {
        Llb_NonlinAddPair(p,bFunc,i,(int)lVar6);
      }
      iVar7 = iVar7 + iVar1;
      lVar6 = lVar6 + 1;
    } while (lVar6 < p->nVars);
  }
  if (iVar7 < p->nSuppMax) {
    iVar7 = p->nSuppMax;
  }
  p->nSuppMax = iVar7;
  return;
}

Assistant:

void Llb_NonlinAddPartition( Llb_Mgr_t * p, int i, DdNode * bFunc )
{
    int k, nSuppSize;
    assert( !Cudd_IsConstant(bFunc) );
    // create partition
    p->pParts[i] = ABC_CALLOC( Llb_Prt_t, 1 );
    p->pParts[i]->iPart = i;
    p->pParts[i]->bFunc = bFunc;
    p->pParts[i]->vVars = Vec_IntAlloc( 8 );
    // add support dependencies
    nSuppSize = 0;
    Extra_SupportArray( p->dd, bFunc, p->pSupp );
    for ( k = 0; k < p->nVars; k++ )
    {
        nSuppSize += p->pSupp[k];
        if ( p->pSupp[k] && p->pVars2Q[k] )
            Llb_NonlinAddPair( p, bFunc, i, k );
    }
    p->nSuppMax = Abc_MaxInt( p->nSuppMax, nSuppSize ); 
}